

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool google::protobuf::anon_unknown_1::RetrieveOptions
               (int depth,Message *options,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *option_entries)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FieldDescriptor *field;
  long lVar2;
  pointer pbVar3;
  pointer pbVar4;
  int iVar5;
  undefined4 extraout_var;
  long *plVar6;
  size_type *psVar7;
  int iVar8;
  ulong uVar9;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Printer printer;
  string fieldval;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  string local_100;
  int local_dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  Message *local_78;
  int local_70;
  int local_6c;
  void *local_68;
  void *pvStack_60;
  long local_58;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_48;
  long *local_40;
  long local_38;
  
  local_48 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)option_entries;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(option_entries,
                    (option_entries->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start);
  iVar5 = (*(options->super_MessageLite)._vptr_MessageLite[0x12])(options);
  local_40 = (long *)CONCAT44(extraout_var,iVar5);
  local_68 = (void *)0x0;
  pvStack_60 = (void *)0x0;
  local_58 = 0;
  local_78 = options;
  (**(code **)(*local_40 + 0x60))(local_40,options);
  if (pvStack_60 != local_68) {
    local_70 = depth + 1;
    local_38 = (long)(depth * 2);
    paVar1 = &local_b8.field_2;
    uVar9 = 0;
    do {
      local_dc = *(int *)(*(long *)((long)local_68 + uVar9 * 8) + 0x30);
      iVar5 = 1;
      if ((local_dc != 3) || (iVar5 = (**(code **)(*local_40 + 0x30))(local_40,local_78), 0 < iVar5)
         ) {
        iVar8 = 0;
        local_6c = iVar5;
        do {
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          local_98._M_string_length = 0;
          local_98.field_2._M_local_buf[0] = '\0';
          field = *(FieldDescriptor **)((long)local_68 + uVar9 * 8);
          if ((*(uint *)(field + 0x2c) & 0xfffffffe) == 10) {
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            local_100._M_string_length = 0;
            local_100.field_2._M_local_buf[0] = '\0';
            TextFormat::Printer::Printer((Printer *)&local_b8);
            local_b8._M_dataplus._M_p._0_4_ = local_70;
            iVar5 = -1;
            if (local_dc == 3) {
              iVar5 = iVar8;
            }
            TextFormat::Printer::PrintFieldValueToString
                      ((Printer *)&local_b8,local_78,
                       *(FieldDescriptor **)((long)local_68 + uVar9 * 8),iVar5,&local_100);
            std::__cxx11::string::append((char *)&local_98);
            std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_100._M_dataplus._M_p);
            std::__cxx11::string::_M_replace_aux
                      ((ulong)&local_98,local_98._M_string_length,0,(char)local_38);
            std::__cxx11::string::append((char *)&local_98);
            TextFormat::Printer::~Printer((Printer *)&local_b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p,
                              CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                       local_100.field_2._M_local_buf[0]) + 1);
            }
          }
          else {
            iVar5 = -1;
            if (local_dc == 3) {
              iVar5 = iVar8;
            }
            TextFormat::PrintFieldValueToString(local_78,field,iVar5,&local_98);
          }
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          local_100._M_string_length = 0;
          local_100.field_2._M_local_buf[0] = '\0';
          lVar2 = *(long *)((long)local_68 + uVar9 * 8);
          if (*(char *)(lVar2 + 0x34) == '\x01') {
            std::operator+(&local_d8,"(.",
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            (lVar2 + 8));
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_d8);
            psVar7 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar7) {
              local_b8.field_2._M_allocated_capacity = *psVar7;
              local_b8.field_2._8_8_ = plVar6[3];
              local_b8._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_b8.field_2._M_allocated_capacity = *psVar7;
              local_b8._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_b8._M_string_length = plVar6[1];
            *plVar6 = (long)psVar7;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_100,(string *)&local_b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != paVar1) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            std::__cxx11::string::_M_assign((string *)&local_100);
          }
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,local_100._M_dataplus._M_p,
                     local_100._M_dataplus._M_p + local_100._M_string_length);
          std::__cxx11::string::append((char *)&local_d8);
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_d8,(ulong)local_98._M_dataplus._M_p);
          psVar7 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_b8.field_2._M_allocated_capacity = *psVar7;
            local_b8.field_2._8_8_ = plVar6[3];
            local_b8._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_b8.field_2._M_allocated_capacity = *psVar7;
            local_b8._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_b8._M_string_length = plVar6[1];
          *plVar6 = (long)psVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_48,&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,
                            CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                     local_100.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,
                            CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                     local_98.field_2._M_local_buf[0]) + 1);
          }
          iVar8 = iVar8 + 1;
        } while (local_6c != iVar8);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)pvStack_60 - (long)local_68 >> 3));
  }
  pbVar3 = *(pointer *)local_48;
  pbVar4 = *(pointer *)(local_48 + 8);
  if (local_68 != (void *)0x0) {
    operator_delete(local_68,local_58 - (long)local_68);
  }
  return pbVar3 != pbVar4;
}

Assistant:

bool RetrieveOptions(int depth,
                     const Message &options,
                     vector<string> *option_entries) {
  option_entries->clear();
  const Reflection* reflection = options.GetReflection();
  vector<const FieldDescriptor*> fields;
  reflection->ListFields(options, &fields);
  for (int i = 0; i < fields.size(); i++) {
    int count = 1;
    bool repeated = false;
    if (fields[i]->is_repeated()) {
      count = reflection->FieldSize(options, fields[i]);
      repeated = true;
    }
    for (int j = 0; j < count; j++) {
      string fieldval;
      if (fields[i]->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
        string tmp;
        TextFormat::Printer printer;
        printer.SetInitialIndentLevel(depth + 1);
        printer.PrintFieldValueToString(options, fields[i],
                                        repeated ? j : -1, &tmp);
        fieldval.append("{\n");
        fieldval.append(tmp);
        fieldval.append(depth * 2, ' ');
        fieldval.append("}");
      } else {
        TextFormat::PrintFieldValueToString(options, fields[i],
                                            repeated ? j : -1, &fieldval);
      }
      string name;
      if (fields[i]->is_extension()) {
        name = "(." + fields[i]->full_name() + ")";
      } else {
        name = fields[i]->name();
      }
      option_entries->push_back(name + " = " + fieldval);
    }
  }
  return !option_entries->empty();
}